

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O0

int secp256k1_eckey_pubkey_tweak_add(secp256k1_ge *key,secp256k1_scalar *tweak)

{
  int iVar1;
  secp256k1_gej pt;
  secp256k1_scalar *in_stack_00000838;
  secp256k1_scalar *in_stack_00000840;
  secp256k1_gej *in_stack_00000848;
  secp256k1_gej *in_stack_00000850;
  secp256k1_ge *in_stack_ffffffffffffff48;
  secp256k1_gej *in_stack_ffffffffffffff50;
  secp256k1_gej *in_stack_ffffffffffffffa8;
  secp256k1_ge *in_stack_ffffffffffffffb0;
  undefined4 local_4;
  
  secp256k1_gej_set_ge(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  secp256k1_ecmult(in_stack_00000850,in_stack_00000848,in_stack_00000840,in_stack_00000838);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x12e98f);
  if (iVar1 == 0) {
    secp256k1_ge_set_gej(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  local_4 = (uint)(iVar1 == 0);
  return local_4;
}

Assistant:

static int secp256k1_eckey_pubkey_tweak_add(secp256k1_ge *key, const secp256k1_scalar *tweak) {
    secp256k1_gej pt;
    secp256k1_gej_set_ge(&pt, key);
    secp256k1_ecmult(&pt, &pt, &secp256k1_scalar_one, tweak);

    if (secp256k1_gej_is_infinity(&pt)) {
        return 0;
    }
    secp256k1_ge_set_gej(key, &pt);
    return 1;
}